

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lista_tests.cpp
# Opt level: O2

void __thiscall
lista_test_test_eliminar_elementos_Test::lista_test_test_eliminar_elementos_Test
          (lista_test_test_eliminar_elementos_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00156ef0;
  return;
}

Assistant:

TEST(lista_test, test_eliminar_elementos) {
    Lista<int> l;
    l.agregarAtras(42);
    l.agregarAtras(43);
    l.agregarAtras(44);
    l.agregarAtras(45);

    l.eliminar(1);

    ASSERT_EQ(l.longitud(), 3);
    ASSERT_EQ(l.iesimo(0), 42);
    ASSERT_EQ(l.iesimo(1), 44);
    ASSERT_EQ(l.iesimo(2), 45);

    l.eliminar(2);

    ASSERT_EQ(l.longitud(), 2);
    ASSERT_EQ(l.iesimo(0), 42);
    ASSERT_EQ(l.iesimo(1), 44);

    l.eliminar(0);
    l.eliminar(0);

    ASSERT_EQ(l.longitud(), 0);
}